

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

QCborValueRef __thiscall QCborValue::operator[](QCborValue *this,qint64 key)

{
  bool bVar1;
  QCborContainerPrivate *pQVar2;
  QCborValueRef QVar3;
  
  pQVar2 = *(QCborContainerPrivate **)(this + 8);
  bVar1 = shouldArrayRemainArray(key,*(Type *)(this + 0x10),pQVar2);
  if (bVar1) {
    pQVar2 = maybeGrow(pQVar2,key);
    *(QCborContainerPrivate **)(this + 8) = pQVar2;
  }
  else {
    QVar3 = QCborContainerPrivate::findOrAddMapKey<long_long>((QCborValue *)this,key);
    key = QVar3.super_QCborValueConstRef.i;
    pQVar2 = QVar3.super_QCborValueConstRef.d;
  }
  QVar3.super_QCborValueConstRef.i = key;
  QVar3.super_QCborValueConstRef.d = pQVar2;
  return (QCborValueRef)QVar3.super_QCborValueConstRef;
}

Assistant:

QCborValueRef QCborValue::operator[](qint64 key)
{
    if (shouldArrayRemainArray(key, t, container)) {
        container = maybeGrow(container, key);
        return { container, qsizetype(key) };
    }
    return QCborContainerPrivate::findOrAddMapKey(*this, key);
}